

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3<float> pbrt::Cross<float>(Vector3<float> *v1,Normal3<float> *v2)

{
  Tuple3<pbrt::Vector3,_float> TVar1;
  undefined8 in_RSI;
  float x;
  float y;
  Vector3<float> *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined8 local_c;
  undefined4 local_4;
  
  x = DifferenceOfProducts<float,float,float,float>
                ((float)((ulong)in_RSI >> 0x20),(float)in_RSI,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
  y = DifferenceOfProducts<float,float,float,float>
                ((float)((ulong)in_RSI >> 0x20),(float)in_RSI,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
  DifferenceOfProducts<float,float,float,float>
            ((float)((ulong)in_RSI >> 0x20),(float)in_RSI,in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8);
  Vector3<float>::Vector3(in_stack_ffffffffffffffd0,x,y,0.0);
  TVar1.z = local_4;
  TVar1._0_8_ = local_c;
  return (Vector3<float>)TVar1;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v1, const Normal3<T> &v2) {
    DCHECK(!v1.HasNaN() && !v2.HasNaN());
    return {DifferenceOfProducts(v1.y, v2.z, v1.z, v2.y),
            DifferenceOfProducts(v1.z, v2.x, v1.x, v2.z),
            DifferenceOfProducts(v1.x, v2.y, v1.y, v2.x)};
}